

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall Catch::Matchers::EndsWithMatcher::match(EndsWithMatcher *this,string *source)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  uVar1 = (this->super_StringMatcherBase).m_comparator.m_str._M_string_length;
  if (uVar1 <= local_30._M_string_length) {
    bVar6 = uVar1 == 0;
    if (bVar6) goto LAB_00195c95;
    pcVar2 = (this->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p;
    if (pcVar2[uVar1 - 1] == local_30._M_dataplus._M_p[local_30._M_string_length - 1]) {
      lVar5 = 0;
      do {
        bVar6 = 1 - uVar1 == lVar5;
        if (bVar6) goto LAB_00195c95;
        lVar4 = lVar5 + (uVar1 - 2);
        lVar3 = lVar5 + (local_30._M_string_length - 2);
        lVar5 = lVar5 + -1;
      } while (pcVar2[lVar4] == local_30._M_dataplus._M_p[lVar3]);
    }
  }
  bVar6 = false;
LAB_00195c95:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool EndsWithMatcher::match(std::string const &source) const {
            return endsWith(m_comparator.adjustString(source), m_comparator.m_str);
        }